

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O2

void nk_push_scissor(nk_command_buffer *b,nk_rect r)

{
  void *pvVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  float local_28;
  float fStack_24;
  float fStack_20;
  float fStack_1c;
  
  if (b != (nk_command_buffer *)0x0) {
    b->clip = r;
    pvVar1 = nk_command_buffer_push(b,NK_COMMAND_SCISSOR,0x18);
    if (pvVar1 != (void *)0x0) {
      local_28 = r.x;
      fStack_24 = r.y;
      fStack_20 = r.x;
      fStack_1c = r.y;
      auVar2._0_4_ = (int)local_28;
      auVar2._4_4_ = (int)fStack_24;
      auVar2._8_4_ = (int)fStack_20;
      auVar2._12_4_ = (int)fStack_1c;
      auVar3 = pshuflw(auVar2,auVar2,0xe8);
      *(int *)((long)pvVar1 + 0x10) = auVar3._0_4_;
      auVar3._8_8_ = r._8_8_;
      auVar3._0_8_ = r._8_8_;
      auVar3 = maxps(auVar3,(undefined1  [16])0x0);
      auVar4._0_4_ = (int)auVar3._0_4_;
      auVar4._4_4_ = (int)auVar3._4_4_;
      auVar4._8_4_ = (int)auVar3._8_4_;
      auVar4._12_4_ = (int)auVar3._12_4_;
      auVar3 = pshuflw(auVar4,auVar4,0xe8);
      *(int *)((long)pvVar1 + 0x14) = auVar3._0_4_;
    }
    return;
  }
  __assert_fail("b",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Rodousse[P]SSSGems/third_party/glfw/deps/nuklear.h"
                ,0x2209,"void nk_push_scissor(struct nk_command_buffer *, struct nk_rect)");
}

Assistant:

NK_API void
nk_push_scissor(struct nk_command_buffer *b, struct nk_rect r)
{
    struct nk_command_scissor *cmd;
    NK_ASSERT(b);
    if (!b) return;

    b->clip.x = r.x;
    b->clip.y = r.y;
    b->clip.w = r.w;
    b->clip.h = r.h;
    cmd = (struct nk_command_scissor*)
        nk_command_buffer_push(b, NK_COMMAND_SCISSOR, sizeof(*cmd));

    if (!cmd) return;
    cmd->x = (short)r.x;
    cmd->y = (short)r.y;
    cmd->w = (unsigned short)NK_MAX(0, r.w);
    cmd->h = (unsigned short)NK_MAX(0, r.h);
}